

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall NetworkDataType::~NetworkDataType(NetworkDataType *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

NDeviceChannel::NDeviceChannel() : NetworkDataType() {
    id = "";
    startByte = -1;
    startBit = -1;
    type = -1;
    interleavedDataByte = -1;
    interleavedDataBit = -1;
}